

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void set_fill_set(lyxp_set *trg,lyxp_set *src)

{
  longdouble lVar1;
  int iVar2;
  uint uVar3;
  char *__s;
  size_t sVar4;
  lyxp_set_node *plVar5;
  hash_table *phVar6;
  
  if (src == (lyxp_set *)0x0 || trg == (lyxp_set *)0x0) {
    return;
  }
  switch(src->type) {
  case LYXP_SET_SNODE_SET:
    trg->type = LYXP_SET_SNODE_SET;
    trg->used = src->used;
    uVar3 = src->used;
    trg->size = uVar3;
    plVar5 = (lyxp_set_node *)ly_realloc((trg->val).nodes,(ulong)uVar3 << 4);
    (trg->val).nodes = plVar5;
    if (plVar5 != (lyxp_set_node *)0x0) {
      memcpy(plVar5,(src->val).nodes,(ulong)src->used << 4);
      return;
    }
    break;
  case LYXP_SET_BOOLEAN:
    iVar2 = (src->val).bool;
    set_free_content(trg);
    trg->type = LYXP_SET_BOOLEAN;
    (trg->val).bool = iVar2;
    return;
  case LYXP_SET_NUMBER:
    lVar1 = (src->val).num;
    set_free_content(trg);
    trg->type = LYXP_SET_NUMBER;
    (trg->val).num = lVar1;
    return;
  case LYXP_SET_STRING:
    __s = (src->val).str;
    sVar4 = strlen(__s);
    set_fill_string(trg,__s,(uint16_t)sVar4);
    return;
  default:
    if ((trg->type | LYXP_SET_NUMBER) == LYXP_SET_STRING) {
      free((trg->val).nodes);
    }
    if (src->type != LYXP_SET_NODE_SET) {
      if (src->type == LYXP_SET_EMPTY) {
        trg->type = LYXP_SET_EMPTY;
        return;
      }
      __assert_fail("src->type == LYXP_SET_NODE_SET",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
                    ,0x373,"void set_fill_set(struct lyxp_set *, struct lyxp_set *)");
    }
    trg->type = LYXP_SET_NODE_SET;
    uVar3 = src->used;
    trg->used = uVar3;
    trg->size = src->used;
    trg->ctx_pos = src->ctx_pos;
    trg->ctx_size = src->ctx_size;
    plVar5 = (lyxp_set_node *)malloc((ulong)uVar3 << 4);
    (trg->val).nodes = plVar5;
    if (plVar5 != (lyxp_set_node *)0x0) {
      memcpy(plVar5,(src->val).nodes,(ulong)src->used << 4);
      phVar6 = lyht_dup(src->ht);
      trg->ht = phVar6;
      return;
    }
  }
  ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","set_fill_set");
  trg->ctx_pos = 0;
  trg->ctx_size = 0;
  *(undefined8 *)&trg->field_0x38 = 0;
  trg->used = 0;
  trg->size = 0;
  trg->ht = (hash_table *)0x0;
  (trg->val).nodes = (lyxp_set_node *)0x0;
  *(undefined8 *)((long)&trg->val + 8) = 0;
  *(undefined8 *)trg = 0;
  *(undefined8 *)&trg->field_0x8 = 0;
  return;
}

Assistant:

static void
set_fill_set(struct lyxp_set *trg, struct lyxp_set *src)
{
    if (!trg || !src) {
        return;
    }

    if (src->type == LYXP_SET_SNODE_SET) {
        trg->type = LYXP_SET_SNODE_SET;
        trg->used = src->used;
        trg->size = src->used;

        trg->val.snodes = ly_realloc(trg->val.snodes, trg->size * sizeof *trg->val.nodes);
        LY_CHECK_ERR_RETURN(!trg->val.nodes, LOGMEM(NULL); memset(trg, 0, sizeof *trg), );
        memcpy(trg->val.nodes, src->val.nodes, src->used * sizeof *src->val.nodes);
    } else if (src->type == LYXP_SET_BOOLEAN) {
        set_fill_boolean(trg, src->val.bool);
    } else if (src->type ==  LYXP_SET_NUMBER) {
        set_fill_number(trg, src->val.num);
    } else if (src->type == LYXP_SET_STRING) {
        set_fill_string(trg, src->val.str, strlen(src->val.str));
    } else {
        if (trg->type == LYXP_SET_NODE_SET) {
            free(trg->val.nodes);
        } else if (trg->type == LYXP_SET_STRING) {
            free(trg->val.str);
        }

        if (src->type == LYXP_SET_EMPTY) {
            trg->type = LYXP_SET_EMPTY;
        } else {
            assert(src->type == LYXP_SET_NODE_SET);

            trg->type = LYXP_SET_NODE_SET;
            trg->used = src->used;
            trg->size = src->used;
            trg->ctx_pos = src->ctx_pos;
            trg->ctx_size = src->ctx_size;

            trg->val.nodes = malloc(trg->used * sizeof *trg->val.nodes);
            LY_CHECK_ERR_RETURN(!trg->val.nodes, LOGMEM(NULL); memset(trg, 0, sizeof *trg), );
            memcpy(trg->val.nodes, src->val.nodes, src->used * sizeof *src->val.nodes);
#ifdef LY_ENABLED_CACHE
            trg->ht = lyht_dup(src->ht);
#endif
        }
    }


}